

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int argc_00;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  Option *pOVar7;
  pointer pOVar8;
  pointer buffer_00;
  type pOVar9;
  Option *local_b0;
  Option *local_80;
  undefined1 local_58 [8];
  Parser parse;
  unique_ptr<option::Option[],_std::default_delete<option::Option[]>_> buffer;
  unique_ptr<option::Option[],_std::default_delete<option::Option[]>_> local_28;
  unique_ptr<option::Option[],_std::default_delete<option::Option[]>_> options;
  Stats stats;
  char **argv_local;
  int argc_local;
  
  argc_00 = argc - (uint)(0 < argc);
  option::Stats::Stats((Stats *)&options,true,usage,argc_00,argv + (int)(uint)(0 < argc_00),0,false)
  ;
  uVar5 = CONCAT44(0,options._M_t.
                     super___uniq_ptr_impl<option::Option,_std::default_delete<option::Option[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_option::Option_*,_std::default_delete<option::Option[]>_>
                     .super__Head_base<0UL,_option::Option_*,_false>._M_head_impl._4_4_);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar5;
  uVar6 = SUB168(auVar1 * ZEXT816(0x30),0);
  if (SUB168(auVar1 * ZEXT816(0x30),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  pOVar7 = (Option *)operator_new__(uVar6);
  if (uVar5 != 0) {
    local_80 = pOVar7;
    do {
      option::Option::Option(local_80);
      local_80 = local_80 + 1;
    } while (local_80 != pOVar7 + uVar5);
  }
  std::unique_ptr<option::Option[],std::default_delete<option::Option[]>>::
  unique_ptr<option::Option*,std::default_delete<option::Option[]>,void,bool>
            ((unique_ptr<option::Option[],std::default_delete<option::Option[]>> *)&local_28,pOVar7)
  ;
  uVar5 = (ulong)(uint)options._M_t.
                       super___uniq_ptr_impl<option::Option,_std::default_delete<option::Option[]>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_option::Option_*,_std::default_delete<option::Option[]>_>
                       .super__Head_base<0UL,_option::Option_*,_false>._M_head_impl;
  pOVar7 = (Option *)operator_new__(uVar5 * 0x30);
  if (uVar5 != 0) {
    local_b0 = pOVar7;
    do {
      option::Option::Option(local_b0);
      local_b0 = local_b0 + 1;
    } while (local_b0 != pOVar7 + uVar5);
  }
  std::unique_ptr<option::Option[],std::default_delete<option::Option[]>>::
  unique_ptr<option::Option*,std::default_delete<option::Option[]>,void,bool>
            ((unique_ptr<option::Option[],std::default_delete<option::Option[]>> *)&parse.err,pOVar7
            );
  pOVar8 = std::unique_ptr<option::Option[],_std::default_delete<option::Option[]>_>::get(&local_28)
  ;
  buffer_00 = std::unique_ptr<option::Option[],_std::default_delete<option::Option[]>_>::get
                        ((unique_ptr<option::Option[],_std::default_delete<option::Option[]>_> *)
                         &parse.err);
  option::Parser::Parser
            ((Parser *)local_58,true,usage,argc_00,argv + (int)(uint)(0 < argc_00),pOVar8,buffer_00,
             0,false,-1);
  bVar2 = option::Parser::error((Parser *)local_58);
  if (!bVar2) {
    pOVar9 = std::unique_ptr<option::Option[],_std::default_delete<option::Option[]>_>::operator[]
                       (&local_28,0);
    iVar3 = option::Option::count(pOVar9);
    iVar4 = option::Parser::optionsCount((Parser *)local_58);
    if (iVar3 != iVar4) {
      pOVar9 = std::unique_ptr<option::Option[],_std::default_delete<option::Option[]>_>::operator[]
                         (&local_28,1);
      pOVar7 = option::Option::operator_cast_to_Option_(pOVar9);
      if ((pOVar7 == (Option *)0x0) && (argc_00 != 0)) {
        pOVar9 = std::unique_ptr<option::Option[],_std::default_delete<option::Option[]>_>::
                 operator[](&local_28,2);
        pOVar7 = option::Option::operator_cast_to_Option_(pOVar9);
        if (pOVar7 == (Option *)0x0) {
          pOVar9 = std::unique_ptr<option::Option[],_std::default_delete<option::Option[]>_>::
                   operator[](&local_28,3);
          pOVar7 = option::Option::operator_cast_to_Option_(pOVar9);
          if (pOVar7 == (Option *)0x0) {
            pOVar9 = std::unique_ptr<option::Option[],_std::default_delete<option::Option[]>_>::
                     operator[](&local_28,4);
            pOVar7 = option::Option::operator_cast_to_Option_(pOVar9);
            if (pOVar7 == (Option *)0x0) {
              argv_local._4_4_ = 0;
            }
            else {
              pOVar8 = std::unique_ptr<option::Option[],_std::default_delete<option::Option[]>_>::
                       get(&local_28);
              argv_local._4_4_ = cli::pack((Parser *)local_58,pOVar8);
            }
            goto LAB_00104df2;
          }
        }
        pOVar8 = std::unique_ptr<option::Option[],_std::default_delete<option::Option[]>_>::get
                           (&local_28);
        argv_local._4_4_ = cli::extract((Parser *)local_58,pOVar8);
      }
      else {
        option::printUsage<std::ostream>
                  ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,usage,0x50,0x32,0x4b);
        argv_local._4_4_ = 0;
      }
      goto LAB_00104df2;
    }
  }
  std::operator<<((ostream *)&std::cerr,"Invalid options\n");
  option::printUsage<std::ostream>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,usage,0x50,0x32,0x4b);
  argv_local._4_4_ = 1;
LAB_00104df2:
  std::unique_ptr<option::Option[],_std::default_delete<option::Option[]>_>::~unique_ptr
            ((unique_ptr<option::Option[],_std::default_delete<option::Option[]>_> *)&parse.err);
  std::unique_ptr<option::Option[],_std::default_delete<option::Option[]>_>::~unique_ptr(&local_28);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
	argc-=(argc>0); argv+=(argc>0); // Skip program name
	option::Stats stats(true, usage, argc, argv);
	std::unique_ptr<option::Option[]> options(new option::Option[stats.options_max]);
	std::unique_ptr<option::Option[]> buffer(new option::Option[stats.buffer_max]);
	option::Parser parse(true, usage, argc, argv, options.get(), buffer.get());

	if (parse.error() || (options[cli::UNKNOWN].count() == parse.optionsCount()))
	{
		std::cerr << "Invalid options\n";
		option::printUsage(std::cout, usage);
		return 1;
	}

	if (options[cli::HELP] || argc == 0)
	{
		option::printUsage(std::cout, usage);
		return 0;
	}

	if (options[cli::LIST] || options[cli::EXTRACT])
	{
		return cli::extract(parse, options.get());
	}
	else if (options[cli::PACK])
	{
		return cli::pack(parse, options.get());
	}

	return 0;
}